

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom,REF_INT *descr,REF_DBL *param)

{
  REF_INT type;
  REF_INT id;
  REF_INT RVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_INT node;
  REF_INT *pRVar4;
  uint uVar5;
  long lVar6;
  REF_INT geom;
  int local_34;
  
  type = *descr;
  id = descr[1];
  RVar1 = descr[2];
  RVar2 = descr[3];
  RVar3 = descr[4];
  node = descr[5];
  uVar5 = ref_geom_add(ref_geom,node,type,id,param);
  if (uVar5 == 0) {
    uVar5 = ref_geom_find(ref_geom,node,type,id,&local_34);
    if (uVar5 == 0) {
      pRVar4 = ref_geom->descr;
      lVar6 = (long)local_34;
      pRVar4[lVar6 * 6 + 2] = RVar1;
      pRVar4[lVar6 * 6 + 4] = RVar3;
      pRVar4[lVar6 * 6 + 3] = RVar2;
      uVar5 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1f9,
             "ref_geom_add_with_descr",(ulong)uVar5,"geom find");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1f8,
           "ref_geom_add_with_descr",(ulong)uVar5,"geom add");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom, REF_INT *descr,
                                           REF_DBL *param) {
  REF_INT type, id, gref, jump, degen, node, geom;
  type = descr[REF_GEOM_DESCR_TYPE];
  id = descr[REF_GEOM_DESCR_ID];
  gref = descr[REF_GEOM_DESCR_GREF];
  jump = descr[REF_GEOM_DESCR_JUMP];
  degen = descr[REF_GEOM_DESCR_DEGEN];
  node = descr[REF_GEOM_DESCR_NODE];
  RSS(ref_geom_add(ref_geom, node, type, id, param), "geom add");
  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "geom find");
  ref_geom_gref(ref_geom, geom) = gref;
  ref_geom_degen(ref_geom, geom) = degen;
  ref_geom_jump(ref_geom, geom) = jump;
  return REF_SUCCESS;
}